

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-test-compare.cc
# Opt level: O2

string * compareObjects(string *__return_storage_ptr__,string *label,QPDFObjectHandle *act,
                       QPDFObjectHandle *exp)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  string *psVar5;
  long lVar6;
  long lVar7;
  void *__s1;
  void *__s2;
  size_t __n;
  char *__rhs;
  allocator<char> local_e9;
  shared_ptr<Buffer> act_data;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_b8 [2];
  QPDFObjectHandle act_filters;
  shared_ptr<Buffer> exp_data;
  QPDFObjectHandle act_dict;
  allocator<char> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  QPDFObjectHandle exp_dict;
  
  iVar3 = QPDFObjectHandle::getTypeCode();
  iVar4 = QPDFObjectHandle::getTypeCode();
  if (iVar3 != iVar4) {
    __rhs = ": different types";
LAB_0010395e:
    std::operator+(__return_storage_ptr__,label,__rhs);
    return __return_storage_ptr__;
  }
  cVar1 = QPDFObjectHandle::isStream();
  if (cVar1 == '\0') {
    QPDFObjectHandle::unparseResolved_abi_cxx11_();
    QPDFObjectHandle::unparseResolved_abi_cxx11_();
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &act_data,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &exp_data);
    std::__cxx11::string::~string((string *)&exp_data);
    std::__cxx11::string::~string((string *)&act_data);
    if (bVar2) {
      __rhs = ": object contents differ";
      goto LAB_0010395e;
    }
LAB_00103d24:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&act_data);
  }
  else {
    QPDFObjectHandle::getDict();
    QPDFObjectHandle::getDict();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&act_data,"/Length",(allocator<char> *)&exp_data);
    QPDFObjectHandle::removeKey((string *)&act_dict);
    std::__cxx11::string::~string((string *)&act_data);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&act_data,"/Length",(allocator<char> *)&exp_data);
    QPDFObjectHandle::removeKey((string *)&exp_dict);
    std::__cxx11::string::~string((string *)&act_data);
    QPDFObjectHandle::unparse_abi_cxx11_();
    QPDFObjectHandle::unparse_abi_cxx11_();
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &act_data,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &exp_data);
    std::__cxx11::string::~string((string *)&exp_data);
    std::__cxx11::string::~string((string *)&act_data);
    if (bVar2) {
      std::operator+(__return_storage_ptr__,label,": stream dictionaries differ");
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&act_data,"/Type",(allocator<char> *)&act_filters);
      QPDFObjectHandle::getKey((string *)local_b8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&exp_data,"/XRef",local_50);
      cVar1 = QPDFObjectHandle::isNameAndEquals((string *)local_b8);
      std::__cxx11::string::~string((string *)&exp_data);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8[0]._M_refcount);
      std::__cxx11::string::~string((string *)&act_data);
      if (cVar1 == '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&act_data,"/Filter",(allocator<char> *)&exp_data);
        QPDFObjectHandle::getKey((string *)&act_filters);
        std::__cxx11::string::~string((string *)&act_data);
        cVar1 = QPDFObjectHandle::isName();
        if (cVar1 != '\0') {
          QPDFObjectHandle::wrapInArray();
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&act_filters,
                     (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&act_data);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&act_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
        cVar1 = QPDFObjectHandle::isArray();
        if (cVar1 == '\0') {
LAB_00103c10:
          exp_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          exp_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          act_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          act_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          QPDFObjectHandle::getRawStreamData();
          std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&act_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>,local_b8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8[0]._M_refcount)
          ;
          QPDFObjectHandle::getRawStreamData();
        }
        else {
          QPDFObjectHandle::aitems();
          QPDFObjectHandle::QPDFArrayItems::begin();
          QPDFObjectHandle::QPDFArrayItems::end();
          while (bVar2 = QPDFObjectHandle::QPDFArrayItems::iterator::operator!=
                                   ((iterator *)&act_data,(iterator *)&exp_data), bVar2) {
            psVar5 = (string *)
                     QPDFObjectHandle::QPDFArrayItems::iterator::operator*((iterator *)&act_data);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_b8,"/FlateDecode",&local_e9);
            cVar1 = QPDFObjectHandle::isNameAndEquals(psVar5);
            std::__cxx11::string::~string((string *)local_b8);
            if (cVar1 != '\0') break;
            QPDFObjectHandle::QPDFArrayItems::iterator::operator++((iterator *)&act_data);
          }
          QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)&exp_data);
          QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)&act_data);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
          act_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          act_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          exp_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          exp_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (!bVar2) goto LAB_00103c10;
          QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)local_b8);
          std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&act_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>,local_b8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8[0]._M_refcount)
          ;
          QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)local_b8);
        }
        std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&exp_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>,local_b8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8[0]._M_refcount);
        lVar6 = Buffer::getSize();
        lVar7 = Buffer::getSize();
        if (lVar6 == lVar7) {
          __s1 = (void *)Buffer::getBuffer();
          __s2 = (void *)Buffer::getBuffer();
          __n = Buffer::getSize();
          iVar3 = bcmp(__s1,__s2,__n);
          bVar2 = iVar3 == 0;
          if (!bVar2) {
            std::operator+(__return_storage_ptr__,label,": stream data differs");
          }
        }
        else {
          std::operator+(__return_storage_ptr__,label,": stream data size differs");
          bVar2 = false;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&exp_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&act_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&act_filters.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&exp_dict.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&act_dict.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        if (!bVar2) {
          return __return_storage_ptr__;
        }
        goto LAB_00103d24;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&act_data);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&exp_dict.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&act_dict.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
compareObjects(std::string const& label, QPDFObjectHandle act, QPDFObjectHandle exp)
{
    if (act.getTypeCode() != exp.getTypeCode()) {
        QTC::TC("compare", "objects with different type");
        return label + ": different types";
    }
    if (act.isStream()) {
        // Disregard stream lengths. The length of stream data is compared later, and we don't care
        // about the length of compressed data as long as the uncompressed data matches.
        auto act_dict = act.getDict();
        auto exp_dict = exp.getDict();
        act_dict.removeKey("/Length");
        exp_dict.removeKey("/Length");
        if (act_dict.unparse() != exp_dict.unparse()) {
            QTC::TC("compare", "different stream dictionaries");
            return label + ": stream dictionaries differ";
        }
        if (act_dict.getKey("/Type").isNameAndEquals("/XRef")) {
            // Cross-reference streams will generally not match, but we have numerous tests that
            // meaningfully ensure that xref streams are correct.
            QTC::TC("compare", "ignore data for xref stream");
            return "";
        }
        auto act_filters = act_dict.getKey("/Filter");
        bool uncompress = false;
        if (act_filters.isName()) {
            act_filters = act_filters.wrapInArray();
        }
        if (act_filters.isArray()) {
            for (auto& filter: act_filters.aitems()) {
                if (filter.isNameAndEquals("/FlateDecode")) {
                    uncompress = true;
                    break;
                }
            }
        }
        std::shared_ptr<Buffer> act_data;
        std::shared_ptr<Buffer> exp_data;
        if (uncompress) {
            QTC::TC("compare", "uncompressing");
            act_data = act.getStreamData();
            exp_data = exp.getStreamData();
        } else {
            QTC::TC("compare", "not uncompressing");
            act_data = act.getRawStreamData();
            exp_data = exp.getRawStreamData();
        }
        if (act_data->getSize() != exp_data->getSize()) {
            QTC::TC("compare", "differing data size", uncompress ? 0 : 1);
            return label + ": stream data size differs";
        }
        auto act_buf = act_data->getBuffer();
        auto exp_buf = exp_data->getBuffer();
        if (memcmp(act_buf, exp_buf, act_data->getSize()) != 0) {
            QTC::TC("compare", "different data", uncompress ? 0 : 1);
            return label + ": stream data differs";
        }
    } else if (act.unparseResolved() != exp.unparseResolved()) {
        QTC::TC("compare", "different non-stream");
        return label + ": object contents differ";
    }
    return "";
}